

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tzfmt.cpp
# Opt level: O1

int32_t __thiscall
icu_63::TimeZoneFormat::parseOffsetLocalizedGMTPattern
          (TimeZoneFormat *this,UnicodeString *text,int32_t start,UBool param_3,int32_t *parsedLen)

{
  ushort uVar1;
  bool bVar2;
  byte bVar3;
  int32_t iVar4;
  char16_t *pcVar5;
  int length;
  int32_t iVar6;
  int32_t len;
  int local_44;
  int32_t *local_40;
  int32_t local_34;
  
  uVar1 = (this->fGMTPatternPrefix).fUnion.fStackFields.fLengthAndFlags;
  if ((short)uVar1 < 0) {
    iVar6 = (this->fGMTPatternPrefix).fUnion.fFields.fLength;
  }
  else {
    iVar6 = (int)(short)uVar1 >> 5;
  }
  local_44 = iVar6;
  if (0 < iVar6) {
    if (((int)(short)uVar1 & 1U) == 0) {
      if ((uVar1 & 2) == 0) {
        pcVar5 = (this->fGMTPatternPrefix).fUnion.fFields.fArray;
      }
      else {
        pcVar5 = (this->fGMTPatternPrefix).fUnion.fStackFields.fBuffer;
      }
      bVar3 = UnicodeString::doCaseCompare(text,start,iVar6,pcVar5,0,iVar6,0);
    }
    else {
      bVar3 = ~*(byte *)&text->fUnion & 1;
    }
    if (bVar3 != 0) {
      bVar2 = true;
      local_34 = 0;
      iVar6 = start;
      goto LAB_001f7f53;
    }
  }
  iVar6 = iVar6 + start;
  local_40 = parsedLen;
  local_34 = parseOffsetFields(this,text,iVar6,'\0',&local_44);
  bVar2 = true;
  parsedLen = local_40;
  if (local_44 != 0) {
    uVar1 = (this->fGMTPatternSuffix).fUnion.fStackFields.fLengthAndFlags;
    if ((short)uVar1 < 0) {
      length = (this->fGMTPatternSuffix).fUnion.fFields.fLength;
    }
    else {
      length = (int)(short)uVar1 >> 5;
    }
    iVar6 = iVar6 + local_44;
    if (0 < length) {
      if (((int)(short)uVar1 & 1U) == 0) {
        if ((uVar1 & 2) == 0) {
          pcVar5 = (this->fGMTPatternSuffix).fUnion.fFields.fArray;
        }
        else {
          pcVar5 = (this->fGMTPatternSuffix).fUnion.fStackFields.fBuffer;
        }
        local_44 = length;
        bVar3 = UnicodeString::doCaseCompare(text,iVar6,length,pcVar5,0,length,0);
      }
      else {
        bVar3 = ~*(byte *)&text->fUnion & 1;
      }
      parsedLen = local_40;
      if (bVar3 != 0) goto LAB_001f7f53;
    }
    iVar6 = iVar6 + length;
    bVar2 = false;
    parsedLen = local_40;
  }
LAB_001f7f53:
  iVar4 = 0;
  if (!bVar2) {
    iVar4 = iVar6 - start;
  }
  *parsedLen = iVar4;
  return local_34;
}

Assistant:

int32_t
TimeZoneFormat::parseOffsetLocalizedGMTPattern(const UnicodeString& text, int32_t start, UBool /*isShort*/, int32_t& parsedLen) const {
    int32_t idx = start;
    int32_t offset = 0;
    UBool parsed = FALSE;

    do {
        // Prefix part
        int32_t len = fGMTPatternPrefix.length();
        if (len > 0 && text.caseCompare(idx, len, fGMTPatternPrefix, 0) != 0) {
            // prefix match failed
            break;
        }
        idx += len;

        // Offset part
        offset = parseOffsetFields(text, idx, FALSE, len);
        if (len == 0) {
            // offset field match failed
            break;
        }
        idx += len;

        len = fGMTPatternSuffix.length();
        if (len > 0 && text.caseCompare(idx, len, fGMTPatternSuffix, 0) != 0) {
            // no suffix match
            break;
        }
        idx += len;
        parsed = TRUE;
    } while (FALSE);

    parsedLen = parsed ? idx - start : 0;
    return offset;
}